

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  int (*paiVar6) [2];
  long *plVar7;
  int (*extraout_RAX) [2];
  undefined8 *puVar8;
  int (*extraout_RAX_00) [2];
  undefined8 extraout_RAX_01;
  long *plVar9;
  stringstream *psVar10;
  int aiVar11 [2];
  int aiVar12 [2];
  int extraout_RDX [2];
  int extraout_RDX_00 [2];
  char *pcVar13;
  ulong uVar14;
  undefined8 uVar15;
  int aiVar16 [2];
  long lVar17;
  int aiVar18 [2];
  int aiVar19 [2];
  int local_13c;
  string local_138;
  int local_118;
  int local_114;
  int pipe_fd [2];
  long local_100;
  int aiStack_f8 [2];
  string local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  int local_c8 [2];
  ulong local_c0;
  int aiStack_b8 [2];
  int local_b0 [2];
  int local_a8 [2];
  ulong local_a0;
  int aiStack_98 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  int local_50 [2];
  int local_48 [2];
  ulong local_40;
  int aiStack_38 [2];
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_70,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/vendor/googletest/googletest/src/gtest-death-test.cc"
                       ,0x344);
    Message::Message((Message *)&local_d0);
    ss.ptr_ = local_d0.ptr_;
    poVar1 = (ostream *)(local_d0.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar4 == 0) {
      lVar17 = 0x26;
      pcVar13 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar17 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar13 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar13,lVar17);
    StringStreamToString(&local_90,ss.ptr_);
    if (ss.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)ss.ptr_ + 8))(ss.ptr_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_70);
  }
  iVar2 = pipe(&local_118);
  if (iVar2 == -1) {
    aiVar18 = (int  [2])&local_100;
    pipe_fd = aiVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
    aiVar19 = (int  [2])&local_a0;
    local_b0 = *paiVar6;
    aiVar16 = (int  [2])(paiVar6 + 2);
    if (local_b0 == aiVar16) {
      local_a0 = *(ulong *)aiVar16;
      aiStack_98 = paiVar6[3];
      local_b0 = aiVar19;
    }
    else {
      local_a0 = *(ulong *)aiVar16;
    }
    local_a8 = paiVar6[1];
    *paiVar6 = aiVar16;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)local_b0);
    aiVar16 = (int  [2])&local_40;
    local_50 = *paiVar6;
    aiVar11 = (int  [2])(paiVar6 + 2);
    if (local_50 == aiVar11) {
      local_40 = *(ulong *)aiVar11;
      aiStack_38 = paiVar6[3];
      local_50 = aiVar16;
    }
    else {
      local_40 = *(ulong *)aiVar11;
    }
    local_48 = paiVar6[1];
    *paiVar6 = aiVar11;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    local_138._M_dataplus._M_p._0_4_ = 0x348;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar14 = 0xf;
    if (local_50 != aiVar16) {
      uVar14 = local_40;
    }
    if (uVar14 < local_f0._M_string_length + (long)local_48) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar15 = local_f0.field_2._M_allocated_capacity;
      }
      aiVar11 = local_50;
      if (local_f0._M_string_length + (long)local_48 <= (ulong)uVar15) goto LAB_00130bca;
    }
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)local_50,(ulong)local_f0._M_dataplus._M_p);
LAB_00130bda:
    local_70 = (long *)*puVar8;
    plVar7 = puVar8 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = puVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)plVar7 = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_70);
    aiVar11 = (int  [2])&local_c0;
    local_d0.ptr_ =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar6;
    aiVar12 = (int  [2])(paiVar6 + 2);
    if ((int  [2])local_d0.ptr_ == aiVar12) {
      local_c0 = *(ulong *)aiVar12;
      aiStack_b8 = paiVar6[3];
      local_d0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)aiVar11;
    }
    else {
      local_c0 = *(ulong *)aiVar12;
    }
    local_c8 = paiVar6[1];
    *paiVar6 = aiVar12;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_d0);
    local_90._M_dataplus._M_p = *(pointer *)paiVar6;
    aiVar12 = (int  [2])(paiVar6 + 2);
    if ((int  [2])local_90._M_dataplus._M_p == aiVar12) {
      local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar12;
      local_90.field_2._8_8_ = paiVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar12;
    }
    local_90._M_string_length = *(size_type *)(paiVar6 + 1);
    *paiVar6 = aiVar12;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    DeathTestAbort(&local_90);
    paiVar6 = extraout_RAX_00;
    local_90._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    aiVar18 = (int  [2])&local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)aiVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((int  [2])local_90._M_dataplus._M_p != aiVar18) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_118);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_114;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_f0);
        pipe_fd = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (pipe_fd == aiVar19) {
          local_100 = *(long *)aiVar19;
          aiStack_f8 = paiVar6[3];
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100 = *(long *)aiVar19;
        }
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)paiVar6[2] = 0;
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
        local_b0 = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (local_b0 == aiVar19) {
          local_a0 = *(ulong *)aiVar19;
          aiStack_98 = paiVar6[3];
          local_b0 = (int  [2])&local_a0;
        }
        else {
          local_a0 = *(ulong *)aiVar19;
        }
        local_a8 = paiVar6[1];
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)paiVar6[2] = 0;
        local_13c = 0x359;
        StreamableToString<int>(&local_138,&local_13c);
        uVar14 = 0xf;
        if (local_b0 != (int  [2])&local_a0) {
          uVar14 = local_a0;
        }
        if (uVar14 < local_138._M_string_length + (long)local_a8) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar15 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_138._M_string_length + (long)local_a8) goto LAB_001306c9;
          paiVar6 = (int (*) [2])
                    std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_b0);
        }
        else {
LAB_001306c9:
          paiVar6 = (int (*) [2])
                    std::__cxx11::string::_M_append
                              ((char *)local_b0,
                               (ulong)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                               local_138._M_dataplus._M_p._0_4_));
        }
        local_50 = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (local_50 == aiVar19) {
          local_40 = *(ulong *)aiVar19;
          aiStack_38 = paiVar6[3];
          local_50 = (int  [2])&local_40;
        }
        else {
          local_40 = *(ulong *)aiVar19;
        }
        local_48 = paiVar6[1];
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)aiVar19 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
        local_70 = (long *)*puVar8;
        plVar7 = puVar8 + 2;
        if (local_70 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = puVar8[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
        }
        local_68 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_d0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar8;
        psVar10 = (stringstream *)(puVar8 + 2);
        if (local_d0.ptr_ == psVar10) {
          local_c0 = *(ulong *)psVar10;
          aiStack_b8 = *(int (*) [2])(puVar8 + 3);
          local_d0.ptr_ = (stringstream *)&local_c0;
        }
        else {
          local_c0 = *(ulong *)psVar10;
        }
        local_c8 = (int  [2])puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_d0);
        local_90._M_dataplus._M_p = *(pointer *)paiVar6;
        aiVar11 = (int  [2])(paiVar6 + 2);
        if ((int  [2])local_90._M_dataplus._M_p != aiVar11) goto LAB_00130b99;
        local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
        local_90.field_2._8_8_ = paiVar6[3];
        local_90._M_dataplus._M_p = (pointer)aiVar18;
      }
      else {
        do {
          iVar2 = close(local_114);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_118;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_f0);
        pipe_fd = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (pipe_fd == aiVar19) {
          local_100 = *(long *)aiVar19;
          aiStack_f8 = paiVar6[3];
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100 = *(long *)aiVar19;
        }
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)paiVar6[2] = 0;
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
        local_b0 = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (local_b0 == aiVar19) {
          local_a0 = *(ulong *)aiVar19;
          aiStack_98 = paiVar6[3];
          local_b0 = (int  [2])&local_a0;
        }
        else {
          local_a0 = *(ulong *)aiVar19;
        }
        local_a8 = paiVar6[1];
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)paiVar6[2] = 0;
        local_13c = 0x365;
        StreamableToString<int>(&local_138,&local_13c);
        uVar14 = 0xf;
        if (local_b0 != (int  [2])&local_a0) {
          uVar14 = local_a0;
        }
        if (uVar14 < local_138._M_string_length + (long)local_a8) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar15 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_138._M_string_length + (long)local_a8) goto LAB_00130557;
          paiVar6 = (int (*) [2])
                    std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_b0);
        }
        else {
LAB_00130557:
          paiVar6 = (int (*) [2])
                    std::__cxx11::string::_M_append
                              ((char *)local_b0,
                               (ulong)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                               local_138._M_dataplus._M_p._0_4_));
        }
        local_50 = *paiVar6;
        aiVar19 = (int  [2])(paiVar6 + 2);
        if (local_50 == aiVar19) {
          local_40 = *(ulong *)aiVar19;
          aiStack_38 = paiVar6[3];
          local_50 = (int  [2])&local_40;
        }
        else {
          local_40 = *(ulong *)aiVar19;
        }
        local_48 = paiVar6[1];
        *paiVar6 = aiVar19;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)aiVar19 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
        local_70 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_70 == plVar9) {
          local_60 = *plVar9;
          lStack_58 = plVar7[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar9;
        }
        local_68 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_d0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
        psVar10 = (stringstream *)(plVar7 + 2);
        if (local_d0.ptr_ == psVar10) {
          local_c0 = *(ulong *)psVar10;
          aiStack_b8 = *(int (*) [2])(plVar7 + 3);
          local_d0.ptr_ = (stringstream *)&local_c0;
        }
        else {
          local_c0 = *(ulong *)psVar10;
        }
        local_c8 = (int  [2])plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_d0);
        local_90._M_dataplus._M_p = *(pointer *)paiVar6;
        aiVar11 = (int  [2])(paiVar6 + 2);
        if ((int  [2])local_90._M_dataplus._M_p == aiVar11) {
          local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
          local_90.field_2._8_8_ = paiVar6[3];
          local_90._M_dataplus._M_p = (pointer)aiVar18;
        }
        else {
          local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
        }
        local_90._M_string_length = *(size_type *)(paiVar6 + 1);
        *paiVar6 = aiVar11;
        paiVar6[1] = (int  [2])0x0;
        *(undefined1 *)paiVar6[2] = 0;
        DeathTestAbort(&local_90);
        paiVar6 = extraout_RAX;
        local_90._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_00130b99:
        local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
      }
      aiVar19 = (int  [2])&local_f0.field_2;
      aiVar16 = (int  [2])&local_100;
      local_90._M_string_length = *(size_type *)(paiVar6 + 1);
      *paiVar6 = aiVar11;
      paiVar6[1] = (int  [2])0x0;
      *(undefined1 *)paiVar6[2] = 0;
      DeathTestAbort(&local_90);
LAB_00130bca:
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)aiVar11);
      goto LAB_00130bda;
    }
    aiVar19 = (int  [2])&local_100;
    pipe_fd = aiVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
    aiVar16 = (int  [2])&local_a0;
    local_b0 = *paiVar6;
    aiVar11 = (int  [2])(paiVar6 + 2);
    if (local_b0 == aiVar11) {
      local_a0 = *(ulong *)aiVar11;
      aiStack_98 = paiVar6[3];
      local_b0 = aiVar16;
    }
    else {
      local_a0 = *(ulong *)aiVar11;
    }
    local_a8 = paiVar6[1];
    *paiVar6 = aiVar11;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)local_b0);
    aiVar11 = (int  [2])&local_40;
    local_50 = *paiVar6;
    aiVar12 = (int  [2])(paiVar6 + 2);
    if (local_50 == aiVar12) {
      local_40 = *(ulong *)aiVar12;
      aiStack_38 = paiVar6[3];
      local_50 = aiVar11;
    }
    else {
      local_40 = *(ulong *)aiVar12;
    }
    local_48 = paiVar6[1];
    *paiVar6 = aiVar12;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    local_138._M_dataplus._M_p._0_4_ = 0x356;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar14 = 0xf;
    if (local_50 != aiVar11) {
      uVar14 = local_40;
    }
    if (uVar14 < local_f0._M_string_length + (long)local_48) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar15 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_f0._M_string_length + (long)local_48) goto LAB_00130b00;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_00130b00:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)local_50,(ulong)local_f0._M_dataplus._M_p);
    }
    local_70 = (long *)*puVar8;
    plVar7 = puVar8 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = puVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)plVar7 = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_70);
    local_d0.ptr_ =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar6;
    aiVar12 = (int  [2])(paiVar6 + 2);
    if ((int  [2])local_d0.ptr_ == aiVar12) {
      local_c0 = *(ulong *)aiVar12;
      aiStack_b8 = paiVar6[3];
      local_d0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
    }
    else {
      local_c0 = *(ulong *)aiVar12;
    }
    local_c8 = paiVar6[1];
    *paiVar6 = aiVar12;
    paiVar6[1] = (int  [2])0x0;
    *(undefined1 *)paiVar6[2] = 0;
    paiVar6 = (int (*) [2])std::__cxx11::string::append((char *)&local_d0);
    local_90._M_dataplus._M_p = *(pointer *)paiVar6;
    aiVar12 = (int  [2])(paiVar6 + 2);
    if ((int  [2])local_90._M_dataplus._M_p == aiVar12) {
      local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar12;
      local_90.field_2._8_8_ = paiVar6[3];
      local_90._M_dataplus._M_p = (pointer)aiVar18;
      goto LAB_00130ddb;
    }
  }
  local_90.field_2._M_allocated_capacity = *(undefined8 *)aiVar12;
LAB_00130ddb:
  local_90._M_string_length = *(size_type *)(paiVar6 + 1);
  *paiVar6 = aiVar12;
  paiVar6[1] = (int  [2])0x0;
  *(undefined1 *)paiVar6[2] = 0;
  DeathTestAbort(&local_90);
  if ((int  [2])local_90._M_dataplus._M_p != aiVar18) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_d0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0) {
    operator_delete(local_d0.ptr_,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != aiVar11) {
    operator_delete((void *)local_50,local_40 + 1);
  }
  if (local_b0 != aiVar16) {
    operator_delete((void *)local_b0,local_a0 + 1);
  }
  if (pipe_fd != aiVar19) {
    operator_delete((void *)pipe_fd,local_100 + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}